

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O0

CodePointMatcherWarehouse * __thiscall
icu_63::numparse::impl::CodePointMatcherWarehouse::operator=
          (CodePointMatcherWarehouse *this,CodePointMatcherWarehouse *src)

{
  CodePointMatcherWarehouse *src_local;
  CodePointMatcherWarehouse *this_local;
  
  std::array<icu_63::numparse::impl::CodePointMatcher,_5UL>::operator=
            (&this->codePoints,&src->codePoints);
  MaybeStackArray<icu_63::numparse::impl::CodePointMatcher_*,_3>::operator=
            (&this->codePointsOverflow,&src->codePointsOverflow);
  this->codePointCount = src->codePointCount;
  this->codePointNumBatches = src->codePointNumBatches;
  return this;
}

Assistant:

CodePointMatcherWarehouse&
CodePointMatcherWarehouse::operator=(CodePointMatcherWarehouse&& src) U_NOEXCEPT {
    codePoints = std::move(src.codePoints);
    codePointsOverflow = std::move(src.codePointsOverflow);
    codePointCount = src.codePointCount;
    codePointNumBatches = src.codePointNumBatches;
    return *this;
}